

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_vectorization.cpp
# Opt level: O0

ostream * operator<<(ostream *o,Vector4d *v)

{
  ostream *poVar1;
  Vector4d *v_local;
  ostream *o_local;
  
  poVar1 = std::operator<<(o,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->data[0]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->data[1]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->data[2]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->data[3]);
  std::operator<<(poVar1,")");
  return o;
}

Assistant:

std::ostream& operator<< (std::ostream& o, const Vector4d& v) {
  o << "(" << v.data[0] << ", " << v.data[1] << ", " << v.data[2] << ", " << v.data[3] << ")";
  return o;
}